

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::replace_illegal_names(CompilerHLSL *this)

{
  int iVar1;
  long lVar2;
  undefined1 local_fcb;
  undefined1 local_fca;
  undefined1 local_fc9;
  undefined1 *local_fc8 [2];
  undefined1 local_fb8 [16];
  undefined1 *local_fa8 [2];
  undefined1 local_f98 [16];
  undefined1 *local_f88 [2];
  undefined1 local_f78 [16];
  undefined1 *local_f68 [2];
  undefined1 local_f58 [16];
  undefined1 *local_f48 [2];
  undefined1 local_f38 [16];
  undefined1 *local_f28 [2];
  undefined1 local_f18 [16];
  undefined1 *local_f08 [2];
  undefined1 local_ef8 [16];
  undefined1 *local_ee8 [2];
  undefined1 local_ed8 [16];
  undefined1 *local_ec8 [2];
  undefined1 local_eb8 [16];
  undefined1 *local_ea8 [2];
  undefined1 local_e98 [16];
  undefined1 *local_e88 [2];
  undefined1 local_e78 [16];
  undefined1 *local_e68 [2];
  undefined1 local_e58 [16];
  undefined1 *local_e48 [2];
  undefined1 local_e38 [16];
  undefined1 *local_e28 [2];
  undefined1 local_e18 [16];
  undefined1 *local_e08 [2];
  undefined1 local_df8 [16];
  undefined1 *local_de8 [2];
  undefined1 local_dd8 [16];
  undefined1 *local_dc8 [2];
  undefined1 local_db8 [16];
  undefined1 *local_da8 [2];
  undefined1 local_d98 [16];
  undefined1 *local_d88 [2];
  undefined1 local_d78 [16];
  undefined1 *local_d68 [2];
  undefined1 local_d58 [16];
  undefined1 *local_d48 [2];
  undefined1 local_d38 [16];
  undefined1 *local_d28 [2];
  undefined1 local_d18 [16];
  undefined1 *local_d08 [2];
  undefined1 local_cf8 [16];
  undefined1 *local_ce8 [2];
  undefined1 local_cd8 [16];
  undefined1 *local_cc8 [2];
  undefined1 local_cb8 [16];
  undefined1 *local_ca8 [2];
  undefined1 local_c98 [16];
  undefined1 *local_c88 [2];
  undefined1 local_c78 [16];
  undefined1 *local_c68 [2];
  undefined1 local_c58 [16];
  undefined1 *local_c48 [2];
  undefined1 local_c38 [16];
  undefined1 *local_c28 [2];
  undefined1 local_c18 [16];
  undefined1 *local_c08 [2];
  undefined1 local_bf8 [16];
  undefined1 *local_be8 [2];
  undefined1 local_bd8 [16];
  undefined1 *local_bc8 [2];
  undefined1 local_bb8 [16];
  undefined1 *local_ba8 [2];
  undefined1 local_b98 [16];
  undefined1 *local_b88 [2];
  undefined1 local_b78 [16];
  undefined1 *local_b68 [2];
  undefined1 local_b58 [16];
  undefined1 *local_b48 [2];
  undefined1 local_b38 [16];
  undefined1 *local_b28 [2];
  undefined1 local_b18 [16];
  undefined1 *local_b08 [2];
  undefined1 local_af8 [16];
  undefined1 *local_ae8 [2];
  undefined1 local_ad8 [16];
  undefined1 *local_ac8 [2];
  undefined1 local_ab8 [16];
  undefined1 *local_aa8 [2];
  undefined1 local_a98 [16];
  undefined1 *local_a88 [2];
  undefined1 local_a78 [16];
  undefined1 *local_a68 [2];
  undefined1 local_a58 [16];
  undefined1 *local_a48 [2];
  undefined1 local_a38 [16];
  undefined1 *local_a28 [2];
  undefined1 local_a18 [16];
  undefined1 *local_a08 [2];
  undefined1 local_9f8 [16];
  undefined1 *local_9e8 [2];
  undefined1 local_9d8 [16];
  undefined1 *local_9c8 [2];
  undefined1 local_9b8 [16];
  undefined1 *local_9a8 [2];
  undefined1 local_998 [16];
  undefined1 *local_988 [2];
  undefined1 local_978 [16];
  undefined1 *local_968 [2];
  undefined1 local_958 [16];
  undefined1 *local_948 [2];
  undefined1 local_938 [16];
  undefined1 *local_928 [2];
  undefined1 local_918 [16];
  undefined1 *local_908 [2];
  undefined1 local_8f8 [16];
  undefined1 *local_8e8 [2];
  undefined1 local_8d8 [16];
  undefined1 *local_8c8 [2];
  undefined1 local_8b8 [16];
  undefined1 *local_8a8 [2];
  undefined1 local_898 [16];
  undefined1 *local_888 [2];
  undefined1 local_878 [16];
  undefined1 *local_868 [2];
  undefined1 local_858 [16];
  undefined1 *local_848 [2];
  undefined1 local_838 [16];
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  undefined1 *local_808 [2];
  undefined1 local_7f8 [16];
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  undefined1 *local_7c8 [2];
  undefined1 local_7b8 [16];
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  undefined1 *local_788 [2];
  undefined1 local_778 [16];
  undefined1 *local_768 [2];
  undefined1 local_758 [16];
  undefined1 *local_748 [2];
  undefined1 local_738 [16];
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [16];
  undefined1 *local_6c8 [2];
  undefined1 local_6b8 [16];
  undefined1 *local_6a8 [2];
  undefined1 local_698 [16];
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  undefined1 *local_668 [2];
  undefined1 local_658 [16];
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  undefined1 *local_5a8 [2];
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (replace_illegal_names()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&replace_illegal_names()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      local_fc8[0] = local_fb8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_fc8,"AppendStructuredBuffer","");
      local_fa8[0] = local_f98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fa8,"asm","");
      local_f88[0] = local_f78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f88,"asm_fragment","");
      local_f68[0] = local_f58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f68,"BlendState","");
      local_f48[0] = local_f38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"bool","");
      local_f28[0] = local_f18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f28,"break","");
      local_f08[0] = local_ef8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f08,"Buffer","");
      local_ee8[0] = local_ed8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ee8,"ByteAddressBuffer","");
      local_ec8[0] = local_eb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ec8,"case","");
      local_ea8[0] = local_e98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ea8,"cbuffer","");
      local_e88[0] = local_e78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e88,"centroid","");
      local_e68[0] = local_e58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e68,"class","");
      local_e48[0] = local_e38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e48,"column_major","");
      local_e28[0] = local_e18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e28,"compile","");
      local_e08[0] = local_df8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"compile_fragment","");
      local_de8[0] = local_dd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_de8,"CompileShader","");
      local_dc8[0] = local_db8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_dc8,"const","");
      local_da8[0] = local_d98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_da8,"continue","");
      local_d88[0] = local_d78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d88,"ComputeShader","");
      local_d68[0] = local_d58;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d68,"ConsumeStructuredBuffer","");
      local_d48[0] = local_d38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d48,"default","");
      local_d28[0] = local_d18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"DepthStencilState","");
      local_d08[0] = local_cf8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d08,"DepthStencilView","");
      local_ce8[0] = local_cd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ce8,"discard","");
      local_cc8[0] = local_cb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_cc8,"do","");
      local_ca8[0] = local_c98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ca8,"double","");
      local_c88[0] = local_c78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"DomainShader","");
      local_c68[0] = local_c58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c68,"dword","");
      local_c48[0] = local_c38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c48,"else","");
      local_c28[0] = local_c18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c28,"export","");
      local_c08[0] = local_bf8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"false","");
      local_be8[0] = local_bd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_be8,"float","");
      local_bc8[0] = local_bb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_bc8,"for","");
      local_ba8[0] = local_b98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ba8,"fxgroup","");
      local_b88[0] = local_b78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"GeometryShader","");
      local_b68[0] = local_b58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,"groupshared","");
      local_b48[0] = local_b38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"half","");
      local_b28[0] = local_b18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"HullShader","");
      local_b08[0] = local_af8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b08,"indices","");
      local_ae8[0] = local_ad8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"if","");
      local_ac8[0] = local_ab8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"in","");
      local_aa8[0] = local_a98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"inline","");
      local_a88[0] = local_a78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a88,"inout","");
      local_a68[0] = local_a58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"InputPatch","");
      local_a48[0] = local_a38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a48,"int","");
      local_a28[0] = local_a18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"interface","");
      local_a08[0] = local_9f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"line","");
      local_9e8[0] = local_9d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"lineadj","");
      local_9c8[0] = local_9b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,"linear","");
      local_9a8[0] = local_998;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"LineStream","");
      local_988[0] = local_978;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"matrix","");
      local_968[0] = local_958;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"min16float","");
      local_948[0] = local_938;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"min10float","");
      local_928[0] = local_918;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"min16int","");
      local_908[0] = local_8f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"min16uint","");
      local_8e8[0] = local_8d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8e8,"namespace","");
      local_8c8[0] = local_8b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"nointerpolation","");
      local_8a8[0] = local_898;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"noperspective","");
      local_888[0] = local_878;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"NULL","");
      local_868[0] = local_858;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_868,"out","");
      local_848[0] = local_838;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"OutputPatch","");
      local_828[0] = local_818;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"payload","");
      local_808[0] = local_7f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"packoffset","");
      local_7e8[0] = local_7d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"pass","");
      local_7c8[0] = local_7b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"pixelfragment","");
      local_7a8[0] = local_798;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"PixelShader","");
      local_788[0] = local_778;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"point","");
      local_768[0] = local_758;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"PointStream","");
      local_748[0] = local_738;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"precise","");
      local_728[0] = local_718;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"RasterizerState","");
      local_708[0] = local_6f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"RenderTargetView","");
      local_6e8[0] = local_6d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"return","");
      local_6c8[0] = local_6b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"register","");
      local_6a8[0] = local_698;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"row_major","");
      local_688[0] = local_678;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"RWBuffer","");
      local_668[0] = local_658;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_668,"RWByteAddressBuffer","");
      local_648[0] = local_638;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"RWStructuredBuffer","")
      ;
      local_628[0] = local_618;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"RWTexture1D","");
      local_608[0] = local_5f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"RWTexture1DArray","");
      local_5e8[0] = local_5d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"RWTexture2D","");
      local_5c8[0] = local_5b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"RWTexture2DArray","");
      local_5a8[0] = local_598;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"RWTexture3D","");
      local_588[0] = local_578;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"sample","");
      local_568[0] = local_558;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"sampler","");
      local_548[0] = local_538;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"SamplerState","");
      local_528[0] = local_518;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_528,"SamplerComparisonState","");
      local_508[0] = local_4f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"shared","");
      local_4e8[0] = local_4d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"snorm","");
      local_4c8[0] = local_4b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"stateblock","");
      local_4a8[0] = local_498;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"stateblock_state","");
      local_488[0] = local_478;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"static","");
      local_468[0] = local_458;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"string","");
      local_448[0] = local_438;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"struct","");
      local_428[0] = local_418;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"switch","");
      local_408[0] = local_3f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"StructuredBuffer","");
      local_3e8[0] = local_3d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"tbuffer","");
      local_3c8[0] = local_3b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"technique","");
      local_3a8[0] = local_398;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"technique10","");
      local_388[0] = local_378;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"technique11","");
      local_368[0] = local_358;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"texture","");
      local_348[0] = local_338;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"Texture1D","");
      local_328[0] = local_318;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Texture1DArray","");
      local_308[0] = local_2f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Texture2D","");
      local_2e8[0] = local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"Texture2DArray","");
      local_2c8[0] = local_2b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"Texture2DMS","");
      local_2a8[0] = local_298;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Texture2DMSArray","");
      local_288[0] = local_278;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"Texture3D","");
      local_268[0] = local_258;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"TextureCube","");
      local_248[0] = local_238;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"TextureCubeArray","");
      local_228[0] = local_218;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"true","");
      local_208[0] = local_1f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"typedef","");
      local_1e8[0] = local_1d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"triangle","");
      local_1c8[0] = local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"triangleadj","");
      local_1a8[0] = local_198;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"TriangleStream","");
      local_188[0] = local_178;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"uint","");
      local_168[0] = local_158;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"uniform","");
      local_148[0] = local_138;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"unorm","");
      local_128[0] = local_118;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"unsigned","");
      local_108[0] = local_f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"vector","");
      local_e8[0] = local_d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"vertexfragment","");
      local_c8[0] = local_b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"VertexShader","");
      local_a8[0] = local_98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"vertices","");
      local_88[0] = local_78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"void","");
      local_68[0] = local_58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"volatile","");
      local_48[0] = local_38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"while","");
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&replace_illegal_names()::keywords_abi_cxx11_,local_fc8,&stack0xffffffffffffffd8
                 ,0,&local_fc9,&local_fca,&local_fcb);
      lVar2 = 0;
      do {
        if (local_38 + lVar2 != *(undefined1 **)((long)local_48 + lVar2)) {
          operator_delete(*(undefined1 **)((long)local_48 + lVar2));
        }
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -4000);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&replace_illegal_names()::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&replace_illegal_names()::keywords_abi_cxx11_);
    }
  }
  CompilerGLSL::replace_illegal_names
            (&this->super_CompilerGLSL,&replace_illegal_names()::keywords_abi_cxx11_);
  CompilerGLSL::replace_illegal_names(&this->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerHLSL::replace_illegal_names()
{
	static const unordered_set<string> keywords = {
		// Additional HLSL specific keywords.
		// From https://docs.microsoft.com/en-US/windows/win32/direct3dhlsl/dx-graphics-hlsl-appendix-keywords
		"AppendStructuredBuffer", "asm", "asm_fragment",
		"BlendState", "bool", "break", "Buffer", "ByteAddressBuffer",
		"case", "cbuffer", "centroid", "class", "column_major", "compile",
		"compile_fragment", "CompileShader", "const", "continue", "ComputeShader",
		"ConsumeStructuredBuffer",
		"default", "DepthStencilState", "DepthStencilView", "discard", "do",
		"double", "DomainShader", "dword",
		"else", "export", "false", "float", "for", "fxgroup",
		"GeometryShader", "groupshared", "half", "HullShader",
		"indices", "if", "in", "inline", "inout", "InputPatch", "int", "interface",
		"line", "lineadj", "linear", "LineStream",
		"matrix", "min16float", "min10float", "min16int", "min16uint",
		"namespace", "nointerpolation", "noperspective", "NULL",
		"out", "OutputPatch",
		"payload", "packoffset", "pass", "pixelfragment", "PixelShader", "point",
		"PointStream", "precise", "RasterizerState", "RenderTargetView",
		"return", "register", "row_major", "RWBuffer", "RWByteAddressBuffer",
		"RWStructuredBuffer", "RWTexture1D", "RWTexture1DArray", "RWTexture2D",
		"RWTexture2DArray", "RWTexture3D", "sample", "sampler", "SamplerState",
		"SamplerComparisonState", "shared", "snorm", "stateblock", "stateblock_state",
		"static", "string", "struct", "switch", "StructuredBuffer", "tbuffer",
		"technique", "technique10", "technique11", "texture", "Texture1D",
		"Texture1DArray", "Texture2D", "Texture2DArray", "Texture2DMS", "Texture2DMSArray",
		"Texture3D", "TextureCube", "TextureCubeArray", "true", "typedef", "triangle",
		"triangleadj", "TriangleStream", "uint", "uniform", "unorm", "unsigned",
		"vector", "vertexfragment", "VertexShader", "vertices", "void", "volatile", "while",
	};

	CompilerGLSL::replace_illegal_names(keywords);
	CompilerGLSL::replace_illegal_names();
}